

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

int __thiscall
tetgenmesh::getsteinerptonsegment(tetgenmesh *this,face *seg,point refpt,point steinpt)

{
  int iVar1;
  shellface *pppdVar2;
  shellface e1;
  shellface e2;
  point *ppdVar3;
  tetgenmesh *ptVar4;
  tetgenmesh *ptVar5;
  int iVar6;
  long lVar7;
  double dVar8;
  double dVar11;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  pppdVar2 = seg->sh;
  e1 = pppdVar2[sorgpivot[seg->shver]];
  e2 = pppdVar2[sdestpivot[seg->shver]];
  if (refpt == (point)0x0) {
    lVar7 = 0;
    do {
      steinpt[lVar7] = ((double)e2[lVar7] - (double)e1[lVar7]) * 0.5 + (double)e1[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    return 0;
  }
  if ((*(uint *)((long)refpt + (long)this->pointmarkindex * 4 + 4) & 0xffffff00) == 0x600) {
    iVar6 = *(int *)(((ulong)refpt[(long)this->point2simindex + 2] & 0xfffffffffffffff8) + 8 +
                    (long)this->shmarkindex * 4);
    ppdVar3 = this->segmentendpointslist;
    iVar1 = *(int *)((long)pppdVar2 + (long)this->shmarkindex * 4 + 8);
    ptVar4 = (tetgenmesh *)ppdVar3[(long)iVar1 * 2];
    ptVar5 = (tetgenmesh *)ppdVar3[iVar1 * 2 + 1];
    if (((tetgenmesh *)ppdVar3[(long)iVar6 * 2] == ptVar4) ||
       (this = (tetgenmesh *)ppdVar3[iVar6 * 2 + 1], this == ptVar4)) {
      dVar8 = (double)ptVar5->in - (double)ptVar4->in;
      dVar12 = (double)ptVar5->addin - (double)ptVar4->addin;
      dVar13 = (double)ptVar5->b - (double)ptVar4->b;
      dVar11 = *refpt - (double)ptVar4->in;
      dVar15 = refpt[1] - (double)ptVar4->addin;
      dVar14 = refpt[2] - (double)ptVar4->b;
      lVar7 = 0;
      do {
        steinpt[lVar7] =
             ((double)(&ptVar5->in)[lVar7] - (double)(&ptVar4->in)[lVar7]) *
             (SQRT(dVar14 * dVar14 + dVar11 * dVar11 + dVar15 * dVar15) /
             SQRT(dVar13 * dVar13 + dVar8 * dVar8 + dVar12 * dVar12)) + (double)(&ptVar4->in)[lVar7]
        ;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
    }
    else {
      if (((tetgenmesh *)ppdVar3[(long)iVar6 * 2] != ptVar5) && (this != ptVar5)) goto LAB_0012bcc7;
      dVar8 = *refpt - (double)ptVar5->in;
      dVar11 = (double)ptVar5->in - (double)ptVar4->in;
      dVar13 = refpt[1] - (double)ptVar5->addin;
      dVar12 = (double)ptVar5->addin - (double)ptVar4->addin;
      dVar15 = refpt[2] - (double)ptVar5->b;
      dVar14 = (double)ptVar5->b - (double)ptVar4->b;
      lVar7 = 0;
      do {
        steinpt[lVar7] =
             ((double)(&ptVar4->in)[lVar7] - (double)(&ptVar5->in)[lVar7]) *
             (SQRT(dVar15 * dVar15 + dVar8 * dVar8 + dVar13 * dVar13) /
             SQRT(dVar14 * dVar14 + dVar11 * dVar11 + dVar12 * dVar12)) +
             (double)(&ptVar5->in)[lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
    }
    iVar6 = 1;
  }
  else {
LAB_0012bcc7:
    projpt2edge(this,refpt,(double *)e1,(double *)e2,steinpt);
    iVar6 = 0;
  }
  dVar8 = (double)*e1 - *steinpt;
  dVar11 = (double)*e2 - (double)*e1;
  dVar12 = (double)e1[1] - steinpt[1];
  dVar13 = (double)e2[1] - (double)e1[1];
  auVar9._0_8_ = dVar8 * dVar8 + dVar12 * dVar12;
  auVar9._8_8_ = dVar11 * dVar11 + dVar13 * dVar13;
  dVar8 = (double)e1[2] - steinpt[2];
  dVar11 = (double)e2[2] - (double)e1[2];
  auVar10._8_8_ = dVar11 * dVar11 + auVar9._8_8_;
  auVar10._0_8_ = dVar8 * dVar8 + auVar9._0_8_;
  auVar10 = sqrtpd(auVar9,auVar10);
  dVar8 = auVar10._0_8_ / auVar10._8_8_;
  if ((dVar8 < 0.2) || (0.8 < dVar8)) {
    lVar7 = 0;
    do {
      steinpt[lVar7] = ((double)e2[lVar7] - (double)e1[lVar7]) * 0.5 + (double)e1[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
  }
  return iVar6;
}

Assistant:

int tetgenmesh::getsteinerptonsegment(face* seg, point refpt, point steinpt)
{
  point ei = sorg(*seg);
  point ej = sdest(*seg);
  int adjflag = 0, i;

  if (refpt != NULL) {
    REAL L, L1, t;
  
    if (pointtype(refpt) == FREESEGVERTEX) {
      face parentseg;
      sdecode(point2sh(refpt), parentseg);
      int sidx1 = getfacetindex(parentseg);
      point far_pi = segmentendpointslist[sidx1 * 2];
      point far_pj = segmentendpointslist[sidx1 * 2 + 1];
      int sidx2 = getfacetindex(*seg);
      point far_ei = segmentendpointslist[sidx2 * 2];
      point far_ej = segmentendpointslist[sidx2 * 2 + 1];
      if ((far_pi == far_ei) || (far_pj == far_ei)) {
        // Create a Steiner point at the intersection of the segment
        //   [far_ei, far_ej] and the sphere centered at far_ei with 
        //   radius |far_ei - refpt|.
        L = distance(far_ei, far_ej);
        L1 = distance(far_ei, refpt);
        t = L1 / L;
        for (i = 0; i < 3; i++) {
          steinpt[i] = far_ei[i] + t * (far_ej[i] - far_ei[i]);
        }
        adjflag = 1;
      } else if ((far_pi == far_ej) || (far_pj == far_ej)) {
        L = distance(far_ei, far_ej);
        L1 = distance(far_ej, refpt);
        t = L1 / L;
        for (i = 0; i < 3; i++) {
          steinpt[i] = far_ej[i] + t * (far_ei[i] - far_ej[i]);
        }
        adjflag = 1;
      } else {
        // Cut the segment by the projection point of refpt.
        projpt2edge(refpt, ei, ej, steinpt);
      }
    } else {
      // Cut the segment by the projection point of refpt.
      projpt2edge(refpt, ei, ej, steinpt);
    }

    // Make sure that steinpt is not too close to ei and ej.
    L = distance(ei, ej);
    L1 = distance(steinpt, ei);
    t = L1 / L;
    if ((t < 0.2) || (t > 0.8)) {
      // Split the point at the middle.
      for (i = 0; i < 3; i++) {
        steinpt[i] = ei[i] + 0.5 * (ej[i] - ei[i]);
      }
    }
  } else {
    // Split the point at the middle.
    for (i = 0; i < 3; i++) {
      steinpt[i] = ei[i] + 0.5 * (ej[i] - ei[i]);
    }
  }


  return adjflag;
}